

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode_00;
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  bool bVar5;
  undefined8 in_RAX;
  shared_container_t *sc;
  container_t *pcVar6;
  array_container_t *c;
  container_t *pcVar7;
  uint uVar8;
  ushort key;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint8_t newtypecode;
  uint8_t typecode;
  undefined8 uStack_38;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar9 = iVar2 - 1;
  }
  else {
    uVar10 = iVar2 - 1;
    uVar8 = 0;
    uVar11 = uVar10;
    do {
      if ((int)uVar10 < (int)uVar8) {
        uVar9 = ~uVar8;
        break;
      }
      uVar9 = uVar8 + uVar10 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar8 + uVar10 & 0xfffffffe));
      if (uVar1 < key) {
        uVar8 = uVar9 + 1;
        bVar5 = true;
        uVar9 = uVar11;
      }
      else if (key < uVar1) {
        uVar10 = uVar9 - 1;
        bVar5 = true;
        uVar9 = uVar11;
      }
      else {
        bVar5 = false;
      }
      uVar11 = uVar9;
    } while (bVar5);
  }
  uStack_38 = in_RAX;
  if ((int)uVar9 < 0) {
    c = array_container_create();
    pcVar7 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
    ra_insert_new_key_value_at(&r->high_low_container,~uVar9,key,pcVar7,uStack_38._7_1_);
    return;
  }
  uVar11 = uVar9 & 0xffff;
  puVar4 = (r->high_low_container).typecodes;
  sc = (shared_container_t *)(r->high_low_container).containers[uVar11];
  if (puVar4[uVar11] == '\x04') {
    sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar11);
  }
  *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8)) = sc;
  typecode_00 = (r->high_low_container).typecodes[uVar11];
  pcVar7 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
  uStack_38 = CONCAT17(typecode_00,CONCAT16(typecode_00,(undefined6)uStack_38));
  pcVar6 = container_add(pcVar7,(uint16_t)val,typecode_00,(uint8_t *)((long)&uStack_38 + 6));
  if (pcVar6 != pcVar7) {
    container_free(pcVar7,typecode_00);
    (r->high_low_container).containers[uVar9] = pcVar6;
    (r->high_low_container).typecodes[uVar9] = uStack_38._6_1_;
  }
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, (uint16_t)i);
        container_t *container =
            ra_get_container_at_index(ra, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container =
            container_add(newac, val & 0xFFFF, ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}